

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_ext8u_i64_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_aarch64(tcg_ctx,INDEX_op_ext8u_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_ext8u_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_ext8u_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg));
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#elif TCG_TARGET_HAS_ext8u_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext8u_i64, ret, arg);
#else
        tcg_gen_andi_i64(tcg_ctx, ret, arg, 0xffu);
#endif
}